

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.h
# Opt level: O1

FastFieldValuePrinter * __thiscall
google::protobuf::TextFormat::Printer::GetFieldPrinter(Printer *this,FieldDescriptor *field)

{
  bool bVar1;
  pointer prVar2;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar3;
  const_iterator it;
  iterator local_30;
  FieldDescriptor *local_20;
  iterator local_18;
  
  local_20 = field;
  local_30 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
             ::find<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
                         *)&this->custom_printers_,&local_20);
  local_18.ctrl_ = (ctrl_t *)0x0;
  bVar1 = absl::lts_20240722::container_internal::operator==(&local_30,&local_18);
  if (bVar1) {
    puVar3 = &this->default_field_value_printer_;
  }
  else {
    prVar2 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
             ::iterator::operator->(&local_30);
    puVar3 = &prVar2->second;
  }
  return (puVar3->_M_t).
         super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
         .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
         _M_head_impl;
}

Assistant:

const FastFieldValuePrinter* GetFieldPrinter(
        const FieldDescriptor* field) const {
      auto it = custom_printers_.find(field);
      return it == custom_printers_.end() ? default_field_value_printer_.get()
                                          : it->second.get();
    }